

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::dump(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
       *this,ostream *o,bool pretty_print,uint indent_step,uint current_indent)

{
  double dVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  object_t *poVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  array_t *paVar9;
  DecimalSeparator *pDVar10;
  size_t sVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  char cVar14;
  uint uVar15;
  char *pcVar16;
  _Alloc_hider _Var17;
  pointer this_00;
  stringstream ss;
  string_t local_210;
  ulong local_1f0;
  locale local_1e8;
  char *local_1e0;
  char *local_1d8;
  long local_1d0;
  locale local_1c8;
  locale local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  uVar2 = (this->m_type).data;
  if (8 < ((byte)uVar2 & 0xf)) {
    return;
  }
  uVar13 = (ulong)current_indent;
  uVar3 = (uint)pretty_print;
  switch(uVar2 & 0xf) {
  case 0:
    pcVar16 = "null";
    uVar13 = 4;
    break;
  case 1:
    if ((this->m_value).object == (object_t *)0x0) {
      __assert_fail("m_value.object != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x1787,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    if ((((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pcVar16 = "{}";
LAB_001073ec:
      uVar13 = 2;
      break;
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"{",1);
    if (pretty_print) {
      uVar13 = (ulong)(current_indent + indent_step);
      std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
    }
    poVar6 = (this->m_value).object;
    p_Var7 = (poVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar15 = (uint)uVar13;
    if ((_Rb_tree_header *)p_Var7 != &(poVar6->_M_t)._M_impl.super__Rb_tree_header) {
      local_1e0 = ",";
      if (pretty_print) {
        local_1e0 = ",\n";
      }
      local_1d0 = (ulong)uVar3 + 1;
      local_1d8 = "";
      local_1f0 = uVar13;
      if (pretty_print) {
        local_1d8 = " ";
      }
      do {
        if (p_Var7 != (poVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
          std::__ostream_insert<char,std::char_traits<char>>(o,local_1e0,local_1d0);
        }
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)local_1f0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (o,local_1b8->_M_local_buf,local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        escape_string(&local_210,(string_t *)(p_Var7 + 1));
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_210._M_dataplus._M_p,local_210._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_1d8,(ulong)uVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8._M_allocated_capacity + 1);
        }
        dump((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
              *)(p_Var7 + 2),o,pretty_print,indent_step,uVar15);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        poVar6 = (this->m_value).object;
      } while ((_Rb_tree_header *)p_Var7 != &(poVar6->_M_t)._M_impl.super__Rb_tree_header);
    }
    if (pretty_print) {
      uVar15 = uVar15 - indent_step;
      std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_210,(char)uVar15);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_210);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar12) {
      local_1a8._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1a8._8_8_ = plVar8[3];
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8;
    }
    local_1b0 = plVar8[1];
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>(o,local_1b8->_M_local_buf,local_1b0);
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    _Var17._M_p = local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p == &local_210.field_2) {
      return;
    }
    goto LAB_00107616;
  case 2:
    paVar9 = (this->m_value).array;
    if (paVar9 == (array_t *)0x0) {
      __assert_fail("m_value.array != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x17b1,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    if ((paVar9->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (paVar9->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar16 = "[]";
      goto LAB_001073ec;
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"[",1);
    if (pretty_print) {
      local_1f0 = CONCAT44(local_1f0._4_4_,current_indent + indent_step);
      std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
    }
    else {
      local_1f0 = CONCAT44(local_1f0._4_4_,current_indent);
    }
    uVar13 = local_1f0;
    paVar9 = (this->m_value).array;
    this_00 = (paVar9->
              super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (this_00 !=
        (paVar9->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_1d8 = ",";
      if (pretty_print) {
        local_1d8 = ",\n";
      }
      local_1e0 = (char *)((ulong)uVar3 + 1);
      do {
        if (this_00 !=
            (paVar9->
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(o,local_1d8,(long)local_1e0);
        }
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar13);
        std::__ostream_insert<char,std::char_traits<char>>(o,local_1b8->_M_local_buf,local_1b0);
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8._M_allocated_capacity + 1);
        }
        dump(this_00,o,pretty_print,indent_step,(uint)local_1f0);
        this_00 = this_00 + 1;
        paVar9 = (this->m_value).array;
      } while (this_00 !=
               (paVar9->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    cVar14 = (char)local_1f0;
    if (pretty_print) {
      cVar14 = cVar14 - (char)indent_step;
      std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
    }
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,cVar14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(o,local_1b8->_M_local_buf,local_1b0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    goto LAB_0010753c;
  case 3:
    if ((this->m_value).object == (object_t *)0x0) {
      __assert_fail("m_value.string != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x17d9,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"\"","");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(o,local_1b8->_M_local_buf,local_1b0)
    ;
    escape_string(&local_210,(this->m_value).string);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_210._M_dataplus._M_p,local_210._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
LAB_0010753c:
    local_210.field_2._M_allocated_capacity = local_1a8._M_allocated_capacity;
    _Var17._M_p = (pointer)local_1b8;
    if (local_1b8 != &local_1a8) {
LAB_00107616:
      operator_delete(_Var17._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    return;
  case 4:
    pcVar16 = "false";
    if ((ulong)(this->m_value).boolean != 0) {
      pcVar16 = "true";
    }
    uVar13 = (ulong)(this->m_value).boolean ^ 5;
    break;
  case 5:
    std::ostream::_M_insert<long>((long)o);
    return;
  case 6:
    std::ostream::_M_insert<unsigned_long>((ulong)o);
    return;
  case 7:
    if ((uVar2 & 0x10) == 0) {
      dVar1 = (this->m_value).number_float;
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        pcVar16 = "0.0";
        if ((long)dVar1 < 0) {
          pcVar16 = "-0.0";
        }
        uVar13 = 3 - ((long)dVar1 >> 0x3f);
        break;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::locale::locale(&local_1e8);
      pDVar10 = (DecimalSeparator *)operator_new(0x18);
      std::__cxx11::numpunct<char>::numpunct((ulong)pDVar10);
      *(undefined ***)pDVar10 = &PTR__numpunct_00111cd0;
      std::locale::locale<nlohmann::(anonymous_namespace)::DecimalSeparator>
                ((locale *)&local_210,(locale *)local_1e8._M_impl,pDVar10);
      std::ios::imbue(&local_1c8);
      std::locale::~locale(&local_1c8);
      std::locale::~locale((locale *)&local_210);
      std::locale::~locale(&local_1e8);
      *(undefined8 *)((long)&local_1a8 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 8) =
           0xf;
      std::ostream::_M_insert<double>((this->m_value).number_float);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (o,local_210._M_dataplus._M_p,local_210._M_string_length);
    }
    else {
      if ((uVar2 & 0x20) != 0) {
        pcVar16 = "%.*E";
        if (-1 < (char)(byte)uVar2) {
          pcVar16 = "%.*e";
        }
        uVar3 = snprintf((char *)&local_1b8,0x107,pcVar16,(this->m_value).object,(ulong)(uVar2 >> 8)
                        );
        if (((ushort)this->m_type & 0x40) == 0) {
          uVar15 = 0x106;
          if ((int)uVar3 < 0x106) {
            uVar15 = uVar3;
          }
          if (-1 < (int)uVar3) {
            uVar13 = 0;
            do {
              iVar4 = (int)uVar13;
              if ((*(char *)((long)&local_1b8 + uVar13) == '+') && (iVar4 < (int)uVar15)) {
                do {
                  *(undefined1 *)((long)&local_1b8 + uVar13) =
                       *(undefined1 *)((long)&local_1b8 + uVar13 + 1);
                  uVar13 = uVar13 + 1;
                } while (uVar15 != uVar13);
                break;
              }
              uVar13 = uVar13 + 1;
            } while (iVar4 < (int)uVar15);
          }
        }
        sVar11 = strlen((char *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_1b8,sVar11);
        return;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::locale::locale(&local_1e8);
      pDVar10 = (DecimalSeparator *)operator_new(0x18);
      std::__cxx11::numpunct<char>::numpunct((ulong)pDVar10);
      *(undefined ***)pDVar10 = &PTR__numpunct_00111cd0;
      std::locale::locale<nlohmann::(anonymous_namespace)::DecimalSeparator>
                ((locale *)&local_210,(locale *)local_1e8._M_impl,pDVar10);
      std::ios::imbue(&local_1c0);
      std::locale::~locale(&local_1c0);
      std::locale::~locale((locale *)&local_210);
      std::locale::~locale(&local_1e8);
      *(ulong *)((long)&local_1a8 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 8) =
           (ulong)*(byte *)((long)&this->m_type + 1);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
           0xfffffefb | 4;
      std::ostream::_M_insert<double>((this->m_value).number_float);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (o,local_210._M_dataplus._M_p,local_210._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
    return;
  case 8:
    pcVar16 = "<discarded>";
    uVar13 = 0xb;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar16,uVar13);
  return;
}

Assistant:

void dump(std::ostream& o,
                  const bool pretty_print,
                  const unsigned int indent_step,
                  const unsigned int current_indent = 0) const
        {
            // variable to hold indentation for recursive calls
            unsigned int new_indent = current_indent;

            switch (m_type)
            {
                case value_t::object:
                {
                    assert(m_value.object != nullptr);

                    if (m_value.object->empty())
                    {
                        o << "{}";
                        return;
                    }

                    o << "{";

                    // increase indentation
                    if (pretty_print)
                    {
                        new_indent += indent_step;
                        o << "\n";
                    }

                    for (auto i = m_value.object->cbegin(); i != m_value.object->cend(); ++i)
                    {
                        if (i != m_value.object->cbegin())
                        {
                            o << (pretty_print ? ",\n" : ",");
                        }
                        o << string_t(new_indent, ' ') << "\""
                        << escape_string(i->first) << "\":"
                        << (pretty_print ? " " : "");
                        i->second.dump(o, pretty_print, indent_step, new_indent);
                    }

                    // decrease indentation
                    if (pretty_print)
                    {
                        new_indent -= indent_step;
                        o << "\n";
                    }

                    o << string_t(new_indent, ' ') + "}";
                    return;
                }

                case value_t::array:
                {
                    assert(m_value.array != nullptr);

                    if (m_value.array->empty())
                    {
                        o << "[]";
                        return;
                    }

                    o << "[";

                    // increase indentation
                    if (pretty_print)
                    {
                        new_indent += indent_step;
                        o << "\n";
                    }

                    for (auto i = m_value.array->cbegin(); i != m_value.array->cend(); ++i)
                    {
                        if (i != m_value.array->cbegin())
                        {
                            o << (pretty_print ? ",\n" : ",");
                        }
                        o << string_t(new_indent, ' ');
                        i->dump(o, pretty_print, indent_step, new_indent);
                    }

                    // decrease indentation
                    if (pretty_print)
                    {
                        new_indent -= indent_step;
                        o << "\n";
                    }

                    o << string_t(new_indent, ' ') << "]";
                    return;
                }

                case value_t::string:
                {
                    assert(m_value.string != nullptr);
                    o << string_t("\"") << escape_string(*m_value.string) << "\"";
                    return;
                }

                case value_t::boolean:
                {
                    o << (m_value.boolean ? "true" : "false");
                    return;
                }

                case value_t::number_integer:
                {
                    o << m_value.number_integer;
                    return;
                }

                case value_t::number_unsigned:
                {
                    o << m_value.number_unsigned;
                    return;
                }

                case value_t::number_float:
                {
                    // check if number was parsed from a string
                    if (m_type.bits.parsed)
                    {
                        // check if parsed number had an exponent given
                        if (m_type.bits.has_exp)
                        {
                            // buffer size: precision (2^8-1 = 255) + other ('-.e-xxx' = 7) + null (1)
                            char buf[263];
                            int len;

                            // handle capitalization of the exponent
                            if (m_type.bits.exp_cap)
                            {
                                len = snprintf(buf, sizeof(buf), "%.*E",
                                               m_type.bits.precision, m_value.number_float) + 1;
                            }
                            else
                            {
                                len = snprintf(buf, sizeof(buf), "%.*e",
                                               m_type.bits.precision, m_value.number_float) + 1;
                            }

                            // remove '+' sign from the exponent if necessary
                            if (not m_type.bits.exp_plus)
                            {
                                if (len > static_cast<int>(sizeof(buf)))
                                {
                                    len = sizeof(buf);
                                }
                                for (int i = 0; i < len; i++)
                                {
                                    if (buf[i] == '+')
                                    {
                                        for (; i + 1 < len; i++)
                                        {
                                            buf[i] = buf[i + 1];
                                        }
                                    }
                                }
                            }

                            o << buf;
                        }
                        else
                        {
                            // no exponent - output as a decimal
                            std::stringstream ss;
                            ss.imbue(std::locale(std::locale(), new DecimalSeparator));  // fix locale problems
                            ss << std::setprecision(m_type.bits.precision)
                            << std::fixed << m_value.number_float;
                            o << ss.str();
                        }
                    }
                    else
                    {
                        if (m_value.number_float == 0)
                        {
                            // special case for zero to get "0.0"/"-0.0"
                            o << (std::signbit(m_value.number_float) ? "-0.0" : "0.0");
                        }
                        else
                        {
                            // Otherwise 6, 15 or 16 digits of precision allows
                            // round-trip IEEE 754 string->float->string,
                            // string->double->string or string->long double->string;
                            // to be safe, we read this value from
                            // std::numeric_limits<number_float_t>::digits10
                            std::stringstream ss;
                            ss.imbue(std::locale(std::locale(), new DecimalSeparator));  // fix locale problems
                            ss << std::setprecision(std::numeric_limits<double>::digits10)
                            << m_value.number_float;
                            o << ss.str();
                        }
                    }
                    return;
                }

                case value_t::discarded:
                {
                    o << "<discarded>";
                    return;
                }

                case value_t::null:
                {
                    o << "null";
                    return;
                }
            }
        }